

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_server.cpp
# Opt level: O1

string * __thiscall
miniros::ServiceServer::getService_abi_cxx11_(string *__return_storage_ptr__,ServiceServer *this)

{
  element_type *peVar1;
  pointer pcVar2;
  
  peVar1 = (this->impl_).
           super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1 == (element_type *)0x0) || (peVar1->unadvertised_ != false)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (peVar1->service_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (peVar1->service_)._M_string_length)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ServiceServer::getService() const
{
  if (impl_ && impl_->isValid())
  {
    return impl_->service_;
  }

  return std::string();
}